

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void js_object_list_end(JSContext *ctx,JSObjectList *s)

{
  JSContext *in_RSI;
  void *in_stack_ffffffffffffffe8;
  
  js_free(in_RSI,in_stack_ffffffffffffffe8);
  js_free(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void js_object_list_end(JSContext *ctx, JSObjectList *s)
{
    js_free(ctx, s->object_tab);
    js_free(ctx, s->hash_table);
}